

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O3

void __thiscall EventMultiplexer::prepareNextState(EventMultiplexer *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer ppSVar4;
  ulong uVar5;
  pointer ppSVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
      stochNextStateIsPrepared == false) {
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextValue =
         (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         stochCurrentValue;
    (this->super_StochasticEventGenerator).eventNextValue = false;
    ppSVar6 = (this->multiSources).
              super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppSVar4 = (this->multiSources).
              super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (this->multiMode == false) {
      uVar5 = 0;
      if (ppSVar6 == ppSVar4) {
        uVar7 = 0;
      }
      else {
        uVar8 = 1;
        uVar9 = 0;
        do {
          if (ppSVar4[uVar9] != (StochasticEventGenerator *)0x0) {
            uVar3 = (*(ppSVar4[uVar9]->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric._vptr_Parametric[0xf])();
            uVar5 = (ulong)((int)uVar5 + (uVar3 & 0xff));
            ppSVar4 = (this->multiSources).
                      super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppSVar6 = (this->multiSources).
                      super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar9 = (ulong)uVar8;
          uVar7 = (long)ppSVar6 - (long)ppSVar4 >> 3;
          uVar8 = uVar8 + 1;
        } while (uVar9 < uVar7);
      }
      if (uVar7 == uVar5) {
        (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
        stochNextValue =
             (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess
             .stochNextValue + 1.0;
        (this->super_StochasticEventGenerator).eventNextValue = true;
      }
    }
    else if (ppSVar6 != ppSVar4) {
      uVar5 = 0;
      uVar7 = 1;
      do {
        if ((ppSVar4[uVar5] != (StochasticEventGenerator *)0x0) &&
           (iVar2 = (*(ppSVar4[uVar5]->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric._vptr_Parametric[0xf])(), (char)iVar2 != '\0')) {
          (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
          stochNextValue =
               (this->super_StochasticEventGenerator).super_StochasticVariable.
               super_StochasticProcess.stochNextValue + 1.0;
          (this->super_StochasticEventGenerator).eventNextValue = true;
        }
        ppSVar4 = (this->multiSources).
                  super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar1 = uVar7 < (ulong)((long)(this->multiSources).
                                      super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >>
                               3);
        uVar5 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar1);
    }
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextStateIsPrepared = true;
  }
  return;
}

Assistant:

void EventMultiplexer::prepareNextState()
{
    if (!stochNextStateIsPrepared) {
        stochNextValue = stochCurrentValue;
        eventNextValue = false;
        if (multiMode) {
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent()) {
                    stochNextValue += 1.0;
                    eventNextValue = true;
                }
            }
        } else {
            uint amount = 0;
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent())
                    ++amount;
            }
            if (amount == multiSources.size()) {
                stochNextValue += 1.0;
                eventNextValue = true;
            }
        }
        stochNextStateIsPrepared = true;
    }
}